

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBoxPrivate::doHidePopup(QComboBoxPrivate *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->container).wp.d;
  if ((((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
      ((this->container).wp.value != (QObject *)0x0)) &&
     ((*(byte *)(*(long *)((this->container).wp.value + 0x20) + 9) & 0x80) != 0)) {
    QWidget::hide((QWidget *)(this->container).wp.value);
  }
  updateArrow(this,State_None);
  return;
}

Assistant:

void QComboBoxPrivate::doHidePopup()
{
    if (container && container->isVisible())
        container->hide();

    resetButton();
}